

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_red.c
# Opt level: O3

void zzRedCrandMont_fast(word *a,word *mod,size_t n,word mont_param,void *stack)

{
  ulong *puVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  word wVar6;
  ulong uVar7;
  ulong uVar8;
  word wVar9;
  size_t sVar10;
  
  if (n == 0) {
    uVar7 = 0;
    wVar6 = 0;
  }
  else {
    wVar9 = *a;
    sVar10 = 0;
    wVar6 = 0;
    uVar7 = 0;
    do {
      uVar8 = wVar9 * mont_param;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar8;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = -*mod;
      if (!CARRY8(uVar8,uVar7)) {
        puVar1 = a + n + sVar10;
        uVar2 = *puVar1;
        *puVar1 = *puVar1 + uVar8 + uVar7;
        uVar7 = (ulong)CARRY8(uVar2,uVar8 + uVar7);
      }
      uVar8 = wVar6 + SUB168(auVar3 * auVar4,8);
      wVar9 = a[sVar10 + 1] - uVar8;
      wVar6 = (word)(a[sVar10 + 1] < uVar8);
      a[sVar10 + 1] = wVar9;
      sVar10 = sVar10 + 1;
    } while (n != sVar10);
  }
  wVar6 = zzSubW2(a + n + 1,n - 1,wVar6);
  wwCopy(a,a + n,n);
  a[n] = uVar7 - wVar6;
  iVar5 = wwCmp2(a,n + 1,mod,n);
  if (iVar5 < 0) {
    return;
  }
  zzSub2(a,mod,n);
  return;
}

Assistant:

void FAST(zzRedCrandMont)(word a[], const word mod[], size_t n, 
	register word mont_param, void* stack)
{
	register word carry = 0;
	register word borrow = 0;
	register dword prod;
	register word w;
	size_t i;
	// pre
	ASSERT(wwIsDisjoint2(a, 2 * n, mod, n));
	ASSERT(n >= 2 && mod[0] % 2  && wwIsRepW(mod + 1, n - 1, WORD_MAX));
	ASSERT((word)(mod[0] * mont_param + 1) == 0);
	// редукция
	for (i = 0; i < n; ++i)
	{
		zzMul11Lo(w, a[i], mont_param);
		zzMul11(prod, w, WORD_0 - mod[0]);
		w += carry;
		if (w >= carry)
			a[i + n] += w, carry = a[i + n] < w;
		w = (word)(prod >> B_PER_W);
		w += borrow;
		if (w >= borrow)
			borrow = a[i + 1] < w, a[i + 1] -= w;
	}
	// a <- a - borrow * B^{n + 1}
	carry -= zzSubW2(a + n + 1, n - 1, borrow);
	// a <- a / B^n
	wwCopy(a, a + n, n);
	a[n] = carry;
	// a >= mod?
	if (wwCmp2(a, n + 1, mod, n) >= 0)
		// a <- a - mod
		zzSub2(a, mod, n);
	// очистка
	prod = 0;
	carry = borrow = w = 0;
}